

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void adjalign(int n)

{
  int iVar1;
  int newalign;
  int n_local;
  
  iVar1 = u.ualign.record + n;
  if (n < 0) {
    if (iVar1 < u.ualign.record) {
      u.ualign.record = iVar1;
    }
  }
  else if ((u.ualign.record < iVar1) &&
          (u.ualign.record = iVar1, (long)((ulong)moves / 200 + 10) < (long)iVar1)) {
    u.ualign.record = moves / 200 + 10;
  }
  return;
}

Assistant:

void adjalign(int n)
{
	int newalign = u.ualign.record + n;

	if (n < 0) {
		if (newalign < u.ualign.record)
			u.ualign.record = newalign;
	} else
		if (newalign > u.ualign.record) {
			u.ualign.record = newalign;
			if (u.ualign.record > ALIGNLIM)
				u.ualign.record = ALIGNLIM;
		}
}